

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall
chrono::ChMatterSPH::IntLoadResidual_F(ChMatterSPH *this,uint off,ChVectorDynamic<> *R,double c)

{
  long *plVar1;
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [16];
  ChSystem *pCVar4;
  pointer psVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar7;
  bool bVar8;
  byte bVar9;
  undefined8 uVar10;
  ChProximityContainerSPH *this_01;
  pointer psVar11;
  undefined1 (*pauVar12) [64];
  long lVar13;
  ulong uVar14;
  uint uVar15;
  pointer psVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  ulong uVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  double dVar26;
  double dVar27;
  long in_XMM0_Qb;
  ChVector<double> v;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  double local_a8 [3];
  long lStack_90;
  double dStack_88;
  long lStack_80;
  undefined1 auStack_78 [16];
  double dStack_68;
  double dStack_60;
  
  pCVar4 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  psVar16 = (pCVar4->assembly).otherphysicslist.
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (pCVar4->assembly).otherphysicslist.
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  auStack_78._0_8_ = psVar5;
  dStack_88 = c;
  if (psVar16 != psVar5) {
    uVar18 = (ulong)off;
    p_Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lStack_80 = in_XMM0_Qb;
    do {
      peVar6 = (psVar16->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar16->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar6 == (element_type *)0x0) {
        local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_01 = (ChProximityContainerSPH *)0x0;
      }
      else {
        this_01 = (ChProximityContainerSPH *)
                  __dynamic_cast(peVar6,&ChPhysicsItem::typeinfo,&ChProximityContainerSPH::typeinfo,
                                 0);
        if (this_01 == (ChProximityContainerSPH *)0x0 ||
            this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_b8 = this_00;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      dVar26 = DAT_00b689a8;
      dVar27 = DAT_00b689a0;
      uVar10 = VNULL;
      if (this_01 != (ChProximityContainerSPH *)0x0) {
        psVar11 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(this->nodes).
                       super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11;
        if (lVar13 != 0) {
          uVar19 = 1;
          do {
            peVar7 = (psVar11->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            if (peVar7 != (element_type *)Q_ROTATE_X_TO_Z) {
              (peVar7->UserForce).m_data[0] = (double)uVar10;
              *(double *)((long)&peVar7->UserForce + 8) = dVar27;
              *(double *)((long)&peVar7->UserForce + 0x10) = dVar26;
            }
            peVar7->density = 0.0;
            uVar21 = (ulong)uVar19;
            psVar11 = psVar11 + 1;
            uVar19 = uVar19 + 1;
          } while (uVar21 < (ulong)(lVar13 >> 4));
        }
        ChProximityContainerSPH::AccumulateStep1(this_01);
        psVar11 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->nodes).
            super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != psVar11) {
          uVar21 = 0;
          uVar17 = 1;
          do {
            peVar7 = psVar11[uVar21].
                     super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var20 = psVar11[uVar21].
                      super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
            if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
              }
            }
            if (peVar7 == (element_type *)0x0) {
              __assert_fail("mnode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                            ,0x18a,
                            "virtual void chrono::ChMatterSPH::IntLoadResidual_F(const unsigned int, ChVectorDynamic<> &, const double)"
                           );
            }
            dVar27 = peVar7->density;
            dVar26 = 0.0;
            if ((dVar27 != 0.0) || (NAN(dVar27))) {
              dVar26 = (double)(**(code **)((long)(peVar7->super_ChNodeXYZ).super_ChLoadableUVW +
                                           0x90))(peVar7);
              dVar27 = peVar7->density;
              dVar26 = dVar26 / dVar27;
            }
            peVar7->volume = dVar26;
            peVar7->pressure =
                 (dVar27 - (this->material).super_ChContinuumMaterial.density) *
                 (this->material).pressure_stiffness;
            if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
            }
            psVar11 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar8 = uVar17 < (ulong)((long)(this->nodes).
                                           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)psVar11 >> 4);
            uVar21 = uVar17;
            uVar17 = (ulong)((int)uVar17 + 1);
          } while (bVar8);
        }
        ChProximityContainerSPH::AccumulateStep2(this_01);
        psVar11 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->nodes).
            super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == psVar11) goto LAB_005395de;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = dStack_88;
        _auStack_78 = vbroadcastsd_avx512f(auVar3);
        uVar21 = 0;
        uVar17 = 1;
        do {
          pCVar4 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
          dVar27 = (double)(**(code **)((long)((psVar11[uVar21].
                                                super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW + 0x90
                                       ))();
          psVar11 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          peVar7 = psVar11[uVar21].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          local_a8[0] = dVar27 * (pCVar4->G_acc).m_data[0] + (peVar7->UserForce).m_data[0];
          local_a8[1] = dVar27 * (pCVar4->G_acc).m_data[1] +
                        *(double *)((long)&peVar7->UserForce + 8);
          local_a8[2] = dVar27 * (pCVar4->G_acc).m_data[2] +
                        *(double *)((long)&peVar7->UserForce + 0x10);
          p_Var20 = psVar11[uVar21].
                    super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var20->_M_use_count = p_Var20->_M_use_count + 1;
            }
          }
          if ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
              -3 < (long)uVar18) {
            __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                          ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                          "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                         );
          }
          pauVar12 = (undefined1 (*) [64])
                     ((R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                      m_data + uVar18);
          uVar19 = 3;
          if (((ulong)pauVar12 & 7) == 0) {
            uVar15 = -((uint)((ulong)pauVar12 >> 3) & 0x1fffffff) & 7;
            if (uVar15 < 3) {
              uVar19 = uVar15;
            }
            if (uVar15 != 0) goto LAB_0053952e;
          }
          else {
LAB_0053952e:
            auVar23 = vpbroadcastq_avx512f();
            uVar21 = vpcmpuq_avx512f(auVar23,_DAT_0095b7c0,5);
            bVar9 = (byte)uVar21;
            auVar23._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * (long)local_a8[1];
            auVar23._0_8_ = (ulong)(bVar9 & 1) * (long)local_a8[0];
            auVar23._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * (long)local_a8[2];
            auVar23._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * lStack_90;
            auVar23._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * (long)dStack_88;
            auVar23._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * lStack_80;
            auVar23._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * auStack_78._0_8_;
            auVar23._56_8_ = (uVar21 >> 7) * auStack_78._8_8_;
            auVar24._8_8_ =
                 (ulong)((byte)(uVar21 >> 1) & 1) * (long)*(double *)((long)*pauVar12 + 8);
            auVar24._0_8_ = (ulong)(bVar9 & 1) * (long)*(double *)*pauVar12;
            auVar24._16_8_ =
                 (ulong)((byte)(uVar21 >> 2) & 1) * (long)*(double *)((long)*pauVar12 + 0x10);
            auVar24._24_8_ =
                 (ulong)((byte)(uVar21 >> 3) & 1) * (long)*(double *)((long)*pauVar12 + 0x18);
            auVar24._32_8_ =
                 (ulong)((byte)(uVar21 >> 4) & 1) * (long)*(double *)((long)*pauVar12 + 0x20);
            auVar24._40_8_ =
                 (ulong)((byte)(uVar21 >> 5) & 1) * (long)*(double *)((long)*pauVar12 + 0x28);
            auVar24._48_8_ =
                 (ulong)((byte)(uVar21 >> 6) & 1) * (long)*(double *)((long)*pauVar12 + 0x30);
            auVar24._56_8_ = (uVar21 >> 7) * (long)*(double *)((long)*pauVar12 + 0x38);
            auVar23 = vmulpd_avx512f(auVar23,_auStack_78);
            auVar23 = vaddpd_avx512f(auVar23,auVar24);
            auVar25._0_8_ =
                 (ulong)(bVar9 & 1) * auVar23._0_8_ |
                 (ulong)!(bool)(bVar9 & 1) * (long)*(double *)*pauVar12;
            bVar8 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar25._8_8_ =
                 (ulong)bVar8 * auVar23._8_8_ |
                 (ulong)!bVar8 * (long)*(double *)((long)*pauVar12 + 8);
            bVar8 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar25._16_8_ =
                 (ulong)bVar8 * auVar23._16_8_ |
                 (ulong)!bVar8 * (long)*(double *)((long)*pauVar12 + 0x10);
            bVar8 = (bool)((byte)(uVar21 >> 3) & 1);
            auVar25._24_8_ =
                 (ulong)bVar8 * auVar23._24_8_ |
                 (ulong)!bVar8 * (long)*(double *)((long)*pauVar12 + 0x18);
            bVar8 = (bool)((byte)(uVar21 >> 4) & 1);
            auVar25._32_8_ =
                 (ulong)bVar8 * auVar23._32_8_ |
                 (ulong)!bVar8 * (long)*(double *)((long)*pauVar12 + 0x20);
            bVar8 = (bool)((byte)(uVar21 >> 5) & 1);
            auVar25._40_8_ =
                 (ulong)bVar8 * auVar23._40_8_ |
                 (ulong)!bVar8 * (long)*(double *)((long)*pauVar12 + 0x28);
            bVar8 = (bool)((byte)(uVar21 >> 6) & 1);
            auVar25._48_8_ =
                 (ulong)bVar8 * auVar23._48_8_ |
                 (ulong)!bVar8 * (long)*(double *)((long)*pauVar12 + 0x30);
            auVar25._56_8_ =
                 (uVar21 >> 7) * auVar23._56_8_ |
                 (ulong)!SUB81(uVar21 >> 7,0) * (long)*(double *)((long)*pauVar12 + 0x38);
            *pauVar12 = auVar25;
          }
          if (uVar19 < 3) {
            uVar14 = (ulong)(uVar19 << 3);
            auVar22 = vpbroadcastq_avx512vl();
            uVar21 = vpcmpuq_avx512vl(auVar22,_DAT_00955380,5);
            uVar21 = uVar21 & 0xf;
            bVar9 = (byte)uVar21;
            plVar1 = (long *)((long)*pauVar12 + uVar14);
            pauVar2 = (undefined1 (*) [32])((long)*pauVar12 + uVar14);
            auVar22._0_8_ =
                 (ulong)(bVar9 & 1) *
                 (long)((double)((ulong)(bVar9 & 1) * *(long *)((long)local_a8 + uVar14)) *
                        (double)auStack_78._0_8_ + (double)((ulong)(bVar9 & 1) * *plVar1)) |
                 (ulong)!(bool)(bVar9 & 1) * *(long *)*pauVar2;
            bVar8 = (bool)((byte)(uVar21 >> 1) & 1);
            auVar22._8_8_ =
                 (ulong)bVar8 *
                 (long)((double)((ulong)((byte)(uVar21 >> 1) & 1) *
                                *(long *)((long)local_a8 + uVar14 + 8)) * (double)auStack_78._8_8_ +
                       (double)((ulong)((byte)(uVar21 >> 1) & 1) * plVar1[1])) |
                 (ulong)!bVar8 * *(long *)(*pauVar2 + 8);
            bVar8 = (bool)((byte)(uVar21 >> 2) & 1);
            auVar22._16_8_ =
                 (ulong)bVar8 *
                 (long)((double)((ulong)((byte)(uVar21 >> 2) & 1) *
                                *(long *)((long)local_a8 + uVar14 + 0x10)) * dStack_68 +
                       (double)((ulong)((byte)(uVar21 >> 2) & 1) * plVar1[2])) |
                 (ulong)!bVar8 * *(long *)(*pauVar2 + 0x10);
            auVar22._24_8_ =
                 (uVar21 >> 3) *
                 (long)((double)((uVar21 >> 3) * *(long *)((long)&lStack_90 + uVar14)) * dStack_60 +
                       (double)((uVar21 >> 3) * plVar1[3])) |
                 (ulong)!SUB81(uVar21 >> 3,0) * *(long *)(*pauVar2 + 0x18);
            *pauVar2 = auVar22;
          }
          if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
          }
          psVar11 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar18 = (ulong)((int)uVar18 + 3);
          bVar8 = (ulong)((long)(this->nodes).
                                super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4) <=
                  uVar17;
          uVar21 = uVar17;
          uVar17 = (ulong)((int)uVar17 + 1);
          if (bVar8) {
LAB_005395de:
            if (local_b8 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              return;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
            return;
          }
        } while( true );
      }
      psVar16 = psVar16 + 1;
      p_Var20 = local_b8;
    } while (psVar16 != (pointer)auStack_78._0_8_);
  }
  __assert_fail("edges",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                ,0x177,
                "virtual void chrono::ChMatterSPH::IntLoadResidual_F(const unsigned int, ChVectorDynamic<> &, const double)"
               );
}

Assistant:

void ChMatterSPH::IntLoadResidual_F(
    const unsigned int off,  // offset in R residual (not used here! use particle's offsets)
    ChVectorDynamic<>& R,    // result: the R residual, R += c*F
    const double c           // a scaling factor
) {
    // COMPUTE THE SPH FORCES HERE

    // First, find if any ChProximityContainerSPH object is present
    // in the system,

    std::shared_ptr<ChProximityContainerSPH> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerSPH>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterSPH, you must add also a ChProximityContainerSPH.
    if (!edges)
        return;

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of particles's density

    edges->AccumulateStep1();

    // 3- Per-node volume and pressure computation

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // node pressure = k(dens - dens_0);
        mnode->pressure = material.Get_pressure_stiffness() * (mnode->density - material.Get_density());
    }

    // 4- Per-edge forces computation and accumulation

    edges->AccumulateStep2();

    // 5- Per-node load forces

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        // downcast
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        R.segment(off + 3 * j, 3) += c * TotForce.eigen();
    }
}